

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_node_copy_utf8_cstr(mpack_node_t node,char *buffer,size_t bufsize)

{
  char *pcVar1;
  mpack_node_data_t *pmVar2;
  _Bool _Var3;
  mpack_tree_error_t UNRECOVERED_JUMPTABLE;
  mpack_error_t mVar4;
  mpack_tree_t *pmVar5;
  mpack_node_data_t *pmVar6;
  ulong count;
  
  pmVar5 = node.tree;
  pmVar6 = node.data;
  if (pmVar5->error != mpack_ok) {
    *buffer = '\0';
    return;
  }
  if (pmVar6->type == mpack_type_str) {
    count = (ulong)pmVar6->len;
    if (bufsize - 1 < count) {
      *buffer = '\0';
      if (pmVar5->error != mpack_ok) {
        return;
      }
      pmVar5->error = mpack_error_too_big;
      UNRECOVERED_JUMPTABLE = pmVar5->error_fn;
      if (UNRECOVERED_JUMPTABLE == (mpack_tree_error_t)0x0) {
        return;
      }
      mVar4 = mpack_error_too_big;
      goto LAB_00109eaf;
    }
    pcVar1 = pmVar5->data;
    pmVar2 = (pmVar6->value).children;
    _Var3 = mpack_utf8_check_impl((uint8_t *)(pcVar1 + (long)pmVar2),count,false);
    if (_Var3) {
      memcpy(buffer,pcVar1 + (long)pmVar2,count);
      buffer[pmVar6->len] = '\0';
      return;
    }
  }
  *buffer = '\0';
  if (pmVar5->error == mpack_ok) {
    pmVar5->error = mpack_error_type;
    UNRECOVERED_JUMPTABLE = pmVar5->error_fn;
    if (UNRECOVERED_JUMPTABLE != (mpack_tree_error_t)0x0) {
      mVar4 = mpack_error_type;
LAB_00109eaf:
      (*UNRECOVERED_JUMPTABLE)(pmVar5,mVar4);
      return;
    }
  }
  return;
}

Assistant:

void mpack_node_copy_utf8_cstr(mpack_node_t node, char* buffer, size_t bufsize) {

    // we can't break here because the error isn't recoverable; we
    // have to add a null-terminator.
    mpack_assert(buffer != NULL, "buffer is NULL");
    mpack_assert(bufsize >= 1, "buffer size is zero; you must have room for at least a null-terminator");

    if (mpack_node_error(node) != mpack_ok) {
        buffer[0] = '\0';
        return;
    }

    if (node.data->type != mpack_type_str) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_type);
        return;
    }

    if (node.data->len > bufsize - 1) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_too_big);
        return;
    }

    if (!mpack_utf8_check_no_null(mpack_node_data_unchecked(node), node.data->len)) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_type);
        return;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    buffer[node.data->len] = '\0';
}